

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

void free_StreamsInfo(_7z_stream_info *si)

{
  _7z_folder *p_Var1;
  uint uVar2;
  _7z_folder *__ptr;
  _7z_coder *__ptr_00;
  uint uVar3;
  ulong uVar4;
  
  free((si->pi).sizes);
  free((si->pi).positions);
  free_Digest(&(si->pi).digest);
  __ptr = (si->ci).folders;
  if (__ptr != (_7z_folder *)0x0) {
    for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (si->ci).numFolders; uVar3 = uVar3 + 1) {
      p_Var1 = __ptr + uVar4;
      __ptr_00 = __ptr[uVar4].coders;
      if (__ptr_00 != (_7z_coder *)0x0) {
        for (uVar2 = 0; (ulong)uVar2 < p_Var1->numCoders; uVar2 = uVar2 + 1) {
          free(__ptr_00[uVar2].properties);
          __ptr_00 = p_Var1->coders;
        }
        free(__ptr_00);
      }
      free(p_Var1->bindPairs);
      free(p_Var1->packedStreams);
      free(p_Var1->unPackSize);
      __ptr = (si->ci).folders;
    }
    free(__ptr);
  }
  free((si->ss).unpackSizes);
  free((si->ss).digestsDefined);
  free((si->ss).digests);
  return;
}

Assistant:

static void
free_StreamsInfo(struct _7z_stream_info *si)
{
	free_PackInfo(&(si->pi));
	free_CodersInfo(&(si->ci));
	free_SubStreamsInfo(&(si->ss));
}